

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Bra.c
# Opt level: O0

SizeT ARM_Convert(Byte *data,SizeT size,UInt32 ip,int encoding)

{
  int iVar1;
  uint uVar2;
  UInt32 src;
  UInt32 dest;
  SizeT i;
  int encoding_local;
  UInt32 ip_local;
  SizeT size_local;
  Byte *data_local;
  SizeT local_8;
  
  if (size < 4) {
    local_8 = 0;
  }
  else {
    for (i = 0; i <= size - 4; i = i + 4) {
      if (data[i + 3] == 0xeb) {
        if (encoding == 0) {
          iVar1 = -(ip + 8 + (int)i);
        }
        else {
          iVar1 = ip + 8 + (int)i;
        }
        dest = iVar1 + ((uint)data[i + 2] << 0x10 | (uint)data[i + 1] << 8 | (uint)data[i]) * 4;
        uVar2 = dest >> 2;
        data[i + 2] = (Byte)(uVar2 >> 0x10);
        data[i + 1] = (Byte)(uVar2 >> 8);
        data[i] = (Byte)uVar2;
      }
    }
    local_8 = i;
  }
  return local_8;
}

Assistant:

SizeT ARM_Convert(Byte *data, SizeT size, UInt32 ip, int encoding)
{
  SizeT i;
  if (size < 4)
    return 0;
  size -= 4;
  ip += 8;
  for (i = 0; i <= size; i += 4)
  {
    if (data[i + 3] == 0xEB)
    {
      UInt32 dest;
      UInt32 src = ((UInt32)data[i + 2] << 16) | ((UInt32)data[i + 1] << 8) | (data[i + 0]);
      src <<= 2;
      if (encoding)
        dest = ip + (UInt32)i + src;
      else
        dest = src - (ip + (UInt32)i);
      dest >>= 2;
      data[i + 2] = (Byte)(dest >> 16);
      data[i + 1] = (Byte)(dest >> 8);
      data[i + 0] = (Byte)dest;
    }
  }
  return i;
}